

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,WhileStatement *statement)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  int iVar1;
  SubtreeWrapper *pSVar2;
  SubtreeWrapper *pSVar3;
  _Elt_pointer piVar4;
  LabelStatement *pLVar5;
  LabelStatement *this_01;
  SeqStatement *pSVar6;
  undefined4 extraout_var;
  SeqStatement *pSVar7;
  JumpStatement *this_02;
  StatementWrapper *this_03;
  undefined4 extraout_var_00;
  string *psVar8;
  LabelStatement *local_170;
  Label label_cond;
  Label label_join;
  string local_110 [32];
  string local_f0 [32];
  Label local_d0;
  Label local_b0;
  Label local_90;
  Label local_70;
  Label label_true;
  
  pSVar2 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->expression_->super_Node);
  piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  this_00 = &this->offsets_;
  if (piVar4 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  this->current_layer_ =
       (this->current_layer_->children_).
       super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
       super__Vector_impl_data._M_start[piVar4[-1]];
  label_cond.label_._M_dataplus._M_p._0_4_ = 0;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_cond);
  IRT::FrameTranslator::SetupScope(this->current_frame_);
  pSVar3 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->statement_->super_Node);
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar4 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar1 = piVar4[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
  label_cond.label_._M_dataplus._M_p._0_4_ = iVar1 + 1;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&label_cond);
  this->current_layer_ = this->current_layer_->parent_;
  IRT::FrameTranslator::TearDownScope(this->current_frame_);
  IRT::Label::Label(&label_cond);
  IRT::Label::Label(&label_true);
  IRT::Label::Label(&label_join);
  local_170 = (LabelStatement *)operator_new(0x28);
  psVar8 = (string *)&label_join;
  std::__cxx11::string::string((string *)&local_70,psVar8);
  IRT::LabelStatement::LabelStatement(local_170,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (pSVar3 != (SubtreeWrapper *)0x0) {
    pLVar5 = (LabelStatement *)operator_new(0x18);
    this_01 = (LabelStatement *)operator_new(0x28);
    psVar8 = (string *)&label_true;
    std::__cxx11::string::string((string *)&local_90,psVar8);
    IRT::LabelStatement::LabelStatement(this_01,&local_90);
    pSVar6 = (SeqStatement *)operator_new(0x18);
    iVar1 = (*pSVar3->_vptr_SubtreeWrapper[3])(pSVar3);
    pSVar7 = (SeqStatement *)operator_new(0x18);
    this_02 = (JumpStatement *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_b0,(string *)&label_cond);
    IRT::JumpStatement::JumpStatement(this_02,&local_b0);
    IRT::SeqStatement::SeqStatement(pSVar7,(Statement *)this_02,(Statement *)local_170);
    IRT::SeqStatement::SeqStatement
              (pSVar6,(Statement *)CONCAT44(extraout_var,iVar1),(Statement *)pSVar7);
    IRT::SeqStatement::SeqStatement((SeqStatement *)pLVar5,(Statement *)this_01,(Statement *)pSVar6)
    ;
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    local_170 = pLVar5;
  }
  this_03 = (StatementWrapper *)operator_new(0x10);
  pSVar6 = (SeqStatement *)operator_new(0x18);
  pLVar5 = (LabelStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_d0,(string *)&label_cond);
  IRT::LabelStatement::LabelStatement(pLVar5,&local_d0);
  pSVar7 = (SeqStatement *)operator_new(0x18);
  std::__cxx11::string::string(local_f0,psVar8);
  std::__cxx11::string::string(local_110,(string *)&label_join);
  iVar1 = (*pSVar2->_vptr_SubtreeWrapper[4])(pSVar2,local_f0,local_110);
  IRT::SeqStatement::SeqStatement
            (pSVar7,(Statement *)CONCAT44(extraout_var_00,iVar1),&local_170->super_Statement);
  IRT::SeqStatement::SeqStatement(pSVar6,(Statement *)pLVar5,(Statement *)pSVar7);
  IRT::StatementWrapper::StatementWrapper(this_03,(Statement *)pSVar6);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_03;
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&label_join);
  std::__cxx11::string::~string((string *)&label_true);
  std::__cxx11::string::~string((string *)&label_cond);
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(WhileStatement* statement) {
  auto if_expression = Accept(statement->expression_);

  current_layer_ = current_layer_->children_[offsets_.top()];
  offsets_.push(0);
  current_frame_->SetupScope();
  auto while_stmt = Accept(statement->statement_);
  offsets_.pop();
  size_t index = offsets_.top();
  offsets_.pop();
  offsets_.push(index + 1);
  current_layer_ = current_layer_->parent_;
  current_frame_->TearDownScope();

  IRT::Label label_cond;
  IRT::Label label_true;
  IRT::Label label_join;

  IRT::Statement* suffix = new IRT::LabelStatement(label_join);

  IRT::Label* result_true = &label_join;

  if (while_stmt) {
    result_true = &label_true;
    suffix = new IRT::SeqStatement(
        new IRT::LabelStatement(label_true),
        new IRT::SeqStatement(
            while_stmt->ToStatement(),
            new IRT::SeqStatement(new IRT::JumpStatement(label_cond), suffix)));
  }

  tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
      new IRT::LabelStatement(label_cond),
      new IRT::SeqStatement(
          if_expression->ToConditional(*result_true, label_join), suffix)));
}